

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O0

void __thiscall Table::closeTable(Table *this)

{
  bool bVar1;
  reference ppCVar2;
  Customer **i;
  iterator __end1;
  iterator __begin1;
  vector<Customer_*,_std::allocator<Customer_*>_> *__range1;
  Table *this_local;
  
  __end1 = std::vector<Customer_*,_std::allocator<Customer_*>_>::begin(&this->customersList);
  i = (Customer **)std::vector<Customer_*,_std::allocator<Customer_*>_>::end(&this->customersList);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Customer_**,_std::vector<Customer_*,_std::allocator<Customer_*>_>_>
                                *)&i);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<Customer_**,_std::vector<Customer_*,_std::allocator<Customer_*>_>_>
              ::operator*(&__end1);
    if (*ppCVar2 != (Customer *)0x0) {
      (*(*ppCVar2)->_vptr_Customer[1])();
    }
    __gnu_cxx::__normal_iterator<Customer_**,_std::vector<Customer_*,_std::allocator<Customer_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<Customer_*,_std::allocator<Customer_*>_>::clear(&this->customersList);
  std::vector<std::pair<int,_Dish>,_std::allocator<std::pair<int,_Dish>_>_>::clear(&this->orderList)
  ;
  this->open = false;
  return;
}

Assistant:

void Table::closeTable() {
    for (auto &i : customersList) {
        delete i;
    }
    customersList.clear();
    orderList.clear();
    open=false;
}